

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void PredictorAdd11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  __m128i pred_3;
  __m128i B_3;
  __m128i A_3;
  __m128i mask_3;
  __m128i pb_3;
  __m128i TL_lo_4;
  __m128i L_lo_3;
  __m128i pred_2;
  __m128i B_2;
  __m128i A_2;
  __m128i mask_2;
  __m128i pb_2;
  __m128i TL_lo_3;
  __m128i L_lo_2;
  __m128i pred_1;
  __m128i B_1;
  __m128i A_1;
  __m128i mask_1;
  __m128i pb_1;
  __m128i TL_lo_2;
  __m128i L_lo_1;
  __m128i pred;
  __m128i B;
  __m128i A;
  __m128i mask;
  __m128i pb;
  __m128i TL_lo_1;
  __m128i L_lo;
  __m128i s_hi;
  __m128i s_lo;
  __m128i TL_hi;
  __m128i T_hi;
  __m128i TL_lo;
  __m128i T_lo;
  __m128i src;
  __m128i TL;
  __m128i T;
  __m128i L;
  __m128i pa;
  int i;
  ulong local_608;
  undefined8 local_5f8;
  int local_5cc;
  ulong local_5a8;
  char local_3e8;
  char cStack_3e7;
  char cStack_3e6;
  char cStack_3e5;
  undefined1 uStack_3e4;
  undefined1 uStack_3e3;
  undefined1 uStack_3e2;
  undefined1 uStack_3e1;
  char local_3c8;
  char cStack_3c7;
  char cStack_3c6;
  char cStack_3c5;
  char cStack_3c4;
  char cStack_3c3;
  char cStack_3c2;
  char cStack_3c1;
  char cStack_3b4;
  char cStack_3b3;
  char cStack_3b2;
  char cStack_3b1;
  char local_3a8;
  char cStack_3a7;
  char cStack_3a6;
  char cStack_3a5;
  char cStack_3a4;
  char cStack_3a3;
  char cStack_3a2;
  char cStack_3a1;
  char local_398;
  char cStack_397;
  char cStack_396;
  char cStack_395;
  char cStack_394;
  char cStack_393;
  char cStack_392;
  char cStack_391;
  char local_388;
  char cStack_387;
  char cStack_386;
  char cStack_385;
  char cStack_384;
  char cStack_383;
  char cStack_382;
  char cStack_381;
  char local_378;
  char cStack_377;
  char cStack_376;
  char cStack_375;
  char cStack_374;
  char cStack_373;
  char cStack_372;
  char cStack_371;
  undefined4 uStack_334;
  undefined4 uStack_314;
  uint uStack_304;
  undefined4 uStack_2f4;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2b4;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  int local_f8;
  int iStack_f4;
  int local_d8;
  int iStack_d4;
  int local_b8;
  int iStack_b4;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  
  local_5a8 = (ulong)*(uint *)(in_RCX + -4);
  local_5f8 = local_5a8;
  for (local_5cc = 0; local_5cc + 4 <= in_EDX; local_5cc = local_5cc + 4) {
    pauVar1 = (undefined1 (*) [16])(in_RSI + (long)local_5cc * 4);
    uVar15 = *(ulong *)*pauVar1;
    auVar18 = *pauVar1;
    pauVar2 = (undefined1 (*) [16])(in_RSI + (long)(local_5cc + -1) * 4);
    auVar5 = *pauVar2;
    pauVar3 = (undefined1 (*) [16])(in_RDI + (long)local_5cc * 4);
    uVar4 = *(undefined8 *)*pauVar3;
    auVar14 = *pauVar3;
    local_238 = (undefined4)uVar15;
    uStack_234 = (undefined4)(uVar15 >> 0x20);
    local_258 = (undefined4)*(undefined8 *)*pauVar2;
    uStack_254 = (undefined4)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
    uStack_1f0 = (undefined4)*(undefined8 *)(*pauVar1 + 8);
    uStack_1ec = (undefined4)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
    uStack_210 = (undefined4)*(undefined8 *)(*pauVar2 + 8);
    uStack_20c = (undefined4)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
    auVar13._4_4_ = local_238;
    auVar13._0_4_ = local_238;
    auVar13._12_4_ = uStack_234;
    auVar13._8_4_ = uStack_234;
    auVar12._4_4_ = local_238;
    auVar12._0_4_ = local_258;
    auVar12._12_4_ = uStack_234;
    auVar12._8_4_ = uStack_254;
    auVar16 = psadbw(auVar13,auVar12);
    auVar11._4_4_ = uStack_1f0;
    auVar11._0_4_ = uStack_1f0;
    auVar11._12_4_ = uStack_1ec;
    auVar11._8_4_ = uStack_1ec;
    auVar10._4_4_ = uStack_1f0;
    auVar10._0_4_ = uStack_210;
    auVar10._12_4_ = uStack_1ec;
    auVar10._8_4_ = uStack_20c;
    auVar17 = psadbw(auVar11,auVar10);
    auVar16 = packssdw(auVar16,auVar17);
    local_278 = (undefined4)local_5f8;
    uStack_274 = (undefined4)(local_5f8 >> 0x20);
    auVar9._4_4_ = local_238;
    auVar9._0_4_ = local_278;
    auVar9._12_4_ = uStack_234;
    auVar9._8_4_ = uStack_274;
    auVar8._4_4_ = local_238;
    auVar8._0_4_ = local_258;
    auVar8._12_4_ = uStack_234;
    auVar8._8_4_ = uStack_254;
    auVar17 = psadbw(auVar9,auVar8);
    local_98 = auVar17._0_4_;
    iStack_94 = auVar17._4_4_;
    local_a8 = auVar16._0_4_;
    iStack_a4 = auVar16._4_4_;
    iStack_a0 = auVar16._8_4_;
    iStack_9c = auVar16._12_4_;
    uVar15 = CONCAT44(-(uint)(iStack_a4 < iStack_94),-(uint)(local_a8 < local_98)) & local_5f8 |
             ~CONCAT44(-(uint)(iStack_a4 < iStack_94),-(uint)(local_a8 < local_98)) & uVar15;
    local_378 = (char)uVar4;
    cStack_377 = (char)((ulong)uVar4 >> 8);
    cStack_376 = (char)((ulong)uVar4 >> 0x10);
    cStack_375 = (char)((ulong)uVar4 >> 0x18);
    cStack_374 = (char)((ulong)uVar4 >> 0x20);
    cStack_373 = (char)((ulong)uVar4 >> 0x28);
    cStack_372 = (char)((ulong)uVar4 >> 0x30);
    cStack_371 = (char)((ulong)uVar4 >> 0x38);
    local_388 = (char)uVar15;
    cStack_387 = (char)(uVar15 >> 8);
    cStack_386 = (char)(uVar15 >> 0x10);
    cStack_385 = (char)(uVar15 >> 0x18);
    cStack_384 = (char)(uVar15 >> 0x20);
    cStack_383 = (char)(uVar15 >> 0x28);
    cStack_382 = (char)(uVar15 >> 0x30);
    cStack_381 = (char)(uVar15 >> 0x38);
    local_5f8._0_2_ = CONCAT11(cStack_377 + cStack_387,local_378 + local_388);
    local_5f8._0_3_ = CONCAT12(cStack_376 + cStack_386,(undefined2)local_5f8);
    local_5f8._0_4_ = CONCAT13(cStack_375 + cStack_385,(undefined3)local_5f8);
    local_5f8._0_5_ = CONCAT14(cStack_374 + cStack_384,(undefined4)local_5f8);
    local_5f8._0_6_ = CONCAT15(cStack_373 + cStack_383,(undefined5)local_5f8);
    local_5f8._0_7_ = CONCAT16(cStack_372 + cStack_382,(undefined6)local_5f8);
    local_5f8 = CONCAT17(cStack_371 + cStack_381,(undefined7)local_5f8);
    *(undefined4 *)(in_RCX + (long)local_5cc * 4) = (undefined4)local_5f8;
    local_608 = auVar18._4_8_;
    uStack_2b4 = (undefined4)(local_5f8 >> 0x20);
    local_2c8 = auVar18._4_4_;
    uStack_2c4 = auVar18._8_4_;
    local_2d8 = auVar5._4_4_;
    uStack_2d4 = auVar5._8_4_;
    auVar7._4_4_ = local_2c8;
    auVar7._0_4_ = (undefined4)local_5f8;
    auVar7._12_4_ = uStack_2c4;
    auVar7._8_4_ = uStack_2b4;
    auVar6._4_4_ = local_2c8;
    auVar6._0_4_ = local_2d8;
    auVar6._12_4_ = uStack_2c4;
    auVar6._8_4_ = uStack_2d4;
    auVar16 = psadbw(auVar7,auVar6);
    local_b8 = auVar16._0_4_;
    iStack_b4 = auVar16._4_4_;
    uVar15 = CONCAT44(-(uint)(iStack_a0 < iStack_b4),-(uint)(iStack_a4 < local_b8)) & local_5f8 |
             ~CONCAT44(-(uint)(iStack_a0 < iStack_b4),-(uint)(iStack_a4 < local_b8)) & local_608;
    local_398 = auVar14[4];
    cStack_397 = auVar14[5];
    cStack_396 = auVar14[6];
    cStack_395 = auVar14[7];
    cStack_394 = auVar14[8];
    cStack_393 = auVar14[9];
    cStack_392 = auVar14[10];
    cStack_391 = auVar14[0xb];
    local_3a8 = (char)uVar15;
    cStack_3a7 = (char)(uVar15 >> 8);
    cStack_3a6 = (char)(uVar15 >> 0x10);
    cStack_3a5 = (char)(uVar15 >> 0x18);
    cStack_3a4 = (char)(uVar15 >> 0x20);
    cStack_3a3 = (char)(uVar15 >> 0x28);
    cStack_3a2 = (char)(uVar15 >> 0x30);
    cStack_3a1 = (char)(uVar15 >> 0x38);
    local_5f8._0_2_ = CONCAT11(cStack_397 + cStack_3a7,local_398 + local_3a8);
    local_5f8._0_3_ = CONCAT12(cStack_396 + cStack_3a6,(undefined2)local_5f8);
    local_5f8._0_4_ = CONCAT13(cStack_395 + cStack_3a5,(undefined3)local_5f8);
    local_5f8._0_5_ = CONCAT14(cStack_394 + cStack_3a4,(undefined4)local_5f8);
    local_5f8._0_6_ = CONCAT15(cStack_393 + cStack_3a3,(undefined5)local_5f8);
    local_5f8._0_7_ = CONCAT16(cStack_392 + cStack_3a2,(undefined6)local_5f8);
    local_5f8 = CONCAT17(cStack_391 + cStack_3a1,(undefined7)local_5f8);
    *(undefined4 *)(in_RCX + (long)(local_5cc + 1) * 4) = (undefined4)local_5f8;
    local_608 = auVar18._8_8_;
    uStack_2f4 = (undefined4)(local_5f8 >> 0x20);
    uStack_304 = auVar18._12_4_;
    uStack_314 = auVar5._12_4_;
    auVar17._4_4_ = uStack_2c4;
    auVar17._0_4_ = (undefined4)local_5f8;
    auVar17._12_4_ = uStack_304;
    auVar17._8_4_ = uStack_2f4;
    auVar16._4_4_ = uStack_2c4;
    auVar16._0_4_ = uStack_2d4;
    auVar16._12_4_ = uStack_304;
    auVar16._8_4_ = uStack_314;
    auVar18 = psadbw(auVar17,auVar16);
    local_d8 = auVar18._0_4_;
    iStack_d4 = auVar18._4_4_;
    uVar15 = CONCAT44(-(uint)(iStack_9c < iStack_d4),-(uint)(iStack_a0 < local_d8)) & local_5f8 |
             ~CONCAT44(-(uint)(iStack_9c < iStack_d4),-(uint)(iStack_a0 < local_d8)) & local_608;
    cStack_3b4 = auVar14[0xc];
    cStack_3b3 = auVar14[0xd];
    cStack_3b2 = auVar14[0xe];
    cStack_3b1 = auVar14[0xf];
    local_3c8 = (char)uVar15;
    cStack_3c7 = (char)(uVar15 >> 8);
    cStack_3c6 = (char)(uVar15 >> 0x10);
    cStack_3c5 = (char)(uVar15 >> 0x18);
    cStack_3c4 = (char)(uVar15 >> 0x20);
    cStack_3c3 = (char)(uVar15 >> 0x28);
    cStack_3c2 = (char)(uVar15 >> 0x30);
    cStack_3c1 = (char)(uVar15 >> 0x38);
    local_5f8._0_2_ = CONCAT11(cStack_393 + cStack_3c7,cStack_394 + local_3c8);
    local_5f8._0_3_ = CONCAT12(cStack_392 + cStack_3c6,(undefined2)local_5f8);
    local_5f8._0_4_ = CONCAT13(cStack_391 + cStack_3c5,(undefined3)local_5f8);
    local_5f8._0_5_ = CONCAT14(cStack_3b4 + cStack_3c4,(undefined4)local_5f8);
    local_5f8._0_6_ = CONCAT15(cStack_3b3 + cStack_3c3,(undefined5)local_5f8);
    local_5f8._0_7_ = CONCAT16(cStack_3b2 + cStack_3c2,(undefined6)local_5f8);
    local_5f8 = CONCAT17(cStack_3b1 + cStack_3c1,(undefined7)local_5f8);
    *(undefined4 *)(in_RCX + (long)(local_5cc + 2) * 4) = (undefined4)local_5f8;
    local_608 = (ulong)uStack_304;
    uStack_334 = (undefined4)(local_5f8 >> 0x20);
    auVar5._4_4_ = uStack_304;
    auVar5._0_4_ = (undefined4)local_5f8;
    auVar18._4_4_ = uStack_304;
    auVar18._0_4_ = uStack_314;
    auVar5._8_4_ = uStack_334;
    auVar5._12_4_ = 0;
    auVar18._8_8_ = 0;
    auVar18 = psadbw(auVar5,auVar18);
    local_f8 = auVar18._0_4_;
    iStack_f4 = auVar18._4_4_;
    local_5f8 = CONCAT44(-(uint)(0 < iStack_f4),-(uint)(iStack_9c < local_f8)) & local_5f8;
    uVar15 = local_5f8 | ~CONCAT44(-(uint)(0 < iStack_f4),-(uint)(iStack_9c < local_f8)) & local_608
    ;
    local_3e8 = (char)uVar15;
    cStack_3e7 = (char)(uVar15 >> 8);
    cStack_3e6 = (char)(uVar15 >> 0x10);
    cStack_3e5 = (char)(uVar15 >> 0x18);
    uStack_3e4 = (undefined1)(local_5f8 >> 0x20);
    uStack_3e3 = (undefined1)(local_5f8 >> 0x28);
    uStack_3e2 = (undefined1)(local_5f8 >> 0x30);
    uStack_3e1 = (undefined1)(local_5f8 >> 0x38);
    local_5f8._0_2_ = CONCAT11(cStack_3b3 + cStack_3e7,cStack_3b4 + local_3e8);
    local_5f8._0_3_ = CONCAT12(cStack_3b2 + cStack_3e6,(undefined2)local_5f8);
    local_5f8._0_4_ = CONCAT13(cStack_3b1 + cStack_3e5,(undefined3)local_5f8);
    local_5f8._0_5_ = CONCAT14(uStack_3e4,(undefined4)local_5f8);
    local_5f8._0_6_ = CONCAT15(uStack_3e3,(undefined5)local_5f8);
    local_5f8._0_7_ = CONCAT16(uStack_3e2,(undefined6)local_5f8);
    local_5f8 = CONCAT17(uStack_3e1,(undefined7)local_5f8);
    *(undefined4 *)(in_RCX + (long)(local_5cc + 3) * 4) = (undefined4)local_5f8;
  }
  if (local_5cc != in_EDX) {
    (*VP8LPredictorsAdd_C[0xb])
              ((uint32_t *)(in_RDI + (long)local_5cc * 4),(uint32_t *)(in_RSI + (long)local_5cc * 4)
               ,in_EDX - local_5cc,(uint32_t *)(in_RCX + (long)local_5cc * 4));
  }
  return;
}

Assistant:

static void PredictorAdd11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  __m128i pa;
  __m128i L = _mm_cvtsi32_si128(out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    {
      // We can unpack with any value on the upper 32 bits, provided it's the
      // same on both operands (so that their sum of abs diff is zero). Here we
      // use T.
      const __m128i T_lo = _mm_unpacklo_epi32(T, T);
      const __m128i TL_lo = _mm_unpacklo_epi32(TL, T);
      const __m128i T_hi = _mm_unpackhi_epi32(T, T);
      const __m128i TL_hi = _mm_unpackhi_epi32(TL, T);
      const __m128i s_lo = _mm_sad_epu8(T_lo, TL_lo);
      const __m128i s_hi = _mm_sad_epu8(T_hi, TL_hi);
      pa = _mm_packs_epi32(s_lo, s_hi);  // pa = sum |T-TL|
    }
    DO_PRED11(0);
    DO_PRED11_SHIFT;
    DO_PRED11(1);
    DO_PRED11_SHIFT;
    DO_PRED11(2);
    DO_PRED11_SHIFT;
    DO_PRED11(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}